

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>_>_>
* build_base_boundary_column_matrix<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
            (vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>_>_>
             *__return_storage_ptr__,
            map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
            *rows,Column_settings *settings)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  reference __args;
  Column_settings *local_1f0;
  int local_1e4;
  Column_settings *local_1e0;
  Column_settings *local_1d8;
  allocator<unsigned_int> local_1c9;
  uint local_1c8 [4];
  iterator local_1b8;
  size_type local_1b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a8;
  int local_18c;
  Column_settings *local_188;
  Column_settings *local_180;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  int local_154;
  Column_settings *local_150;
  Column_settings *local_148;
  allocator<unsigned_int> local_139;
  uint local_138 [6];
  iterator local_120;
  size_type local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  int local_f4;
  Column_settings *local_f0;
  Column_settings *local_e8;
  allocator<unsigned_int> local_d9;
  uint local_d8 [8];
  iterator local_b8;
  size_type local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  int local_8c;
  Column_settings *local_88;
  Column_settings *local_80 [3];
  allocator<unsigned_int> local_61;
  uint local_60 [4];
  iterator local_50;
  size_type local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  int local_28;
  undefined1 local_21;
  Column_settings *local_20;
  Column_settings *settings_local;
  map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
  *rows_local;
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>_>_>
  *matrix;
  
  local_21 = 0;
  local_20 = settings;
  settings_local = (Column_settings *)rows;
  rows_local = (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                *)__return_storage_ptr__;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>_>_>
  ::vector(__return_storage_ptr__);
  local_28 = 0;
  local_60[0] = 0;
  local_60[1] = 1;
  local_60[2] = 3;
  local_60[3] = 5;
  local_50 = local_60;
  local_48 = 4;
  std::allocator<unsigned_int>::allocator(&local_61);
  __l_02._M_len = local_48;
  __l_02._M_array = local_50;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40,__l_02,&local_61);
  local_80[0] = settings_local;
  local_88 = local_20;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>>
  ::
  emplace_back<int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>*,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>>
              *)__return_storage_ptr__,&local_28,&local_40,
             (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
              **)local_80,&local_88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_40);
  std::allocator<unsigned_int>::~allocator(&local_61);
  local_8c = 1;
  local_d8[0] = 0;
  local_d8[1] = 1;
  local_d8[2] = 2;
  local_d8[3] = 5;
  local_d8[4] = 6;
  local_b8 = local_d8;
  local_b0 = 5;
  std::allocator<unsigned_int>::allocator(&local_d9);
  __l_01._M_len = local_b0;
  __l_01._M_array = local_b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a8,__l_01,&local_d9);
  local_e8 = settings_local;
  local_f0 = local_20;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>>
  ::
  emplace_back<int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>*,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>>
              *)__return_storage_ptr__,&local_8c,&local_a8,
             (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
              **)&local_e8,&local_f0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a8);
  std::allocator<unsigned_int>::~allocator(&local_d9);
  local_f4 = 2;
  local_138[0] = 0;
  local_138[1] = 1;
  local_138[2] = 2;
  local_138[3] = 5;
  local_138[4] = 6;
  local_120 = local_138;
  local_118 = 5;
  std::allocator<unsigned_int>::allocator(&local_139);
  __l_00._M_len = local_118;
  __l_00._M_array = local_120;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_110,__l_00,&local_139);
  local_148 = settings_local;
  local_150 = local_20;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>>
  ::
  emplace_back<int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>*,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>>
              *)__return_storage_ptr__,&local_f4,&local_110,
             (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
              **)&local_148,&local_150);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_110);
  std::allocator<unsigned_int>::~allocator(&local_139);
  local_154 = 3;
  local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_178);
  local_180 = settings_local;
  local_188 = local_20;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>>
  ::
  emplace_back<int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>*,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>>
              *)__return_storage_ptr__,&local_154,&local_178,
             (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
              **)&local_180,&local_188);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_178);
  local_18c = 4;
  local_1c8[0] = 0;
  local_1c8[1] = 1;
  local_1c8[2] = 3;
  local_1c8[3] = 5;
  local_1b8 = local_1c8;
  local_1b0 = 4;
  std::allocator<unsigned_int>::allocator(&local_1c9);
  __l._M_len = local_1b0;
  __l._M_array = local_1b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1a8,__l,&local_1c9);
  local_1d8 = settings_local;
  local_1e0 = local_20;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>>
  ::
  emplace_back<int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>*,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>>
              *)__return_storage_ptr__,&local_18c,&local_1a8,
             (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
              **)&local_1d8,&local_1e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1a8);
  std::allocator<unsigned_int>::~allocator(&local_1c9);
  __args = std::
           vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>_>_>
           ::operator[](__return_storage_ptr__,1);
  local_1e4 = 5;
  local_1f0 = settings_local;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>>
  ::
  emplace_back<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>&,int,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>*>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>>
              *)__return_storage_ptr__,__args,&local_1e4,
             (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
              **)&local_1f0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Column> build_base_boundary_column_matrix(Rows& rows, typename Column::Column_settings& settings) {
  std::vector<Column> matrix;

  if constexpr (is_z2<Column>()) {
    using cont = std::vector<unsigned int>;
    matrix.emplace_back(0, cont{0, 1, 3, 5}, &rows, &settings);
    matrix.emplace_back(1, cont{0, 1, 2, 5, 6}, &rows, &settings);
    matrix.emplace_back(2, cont{0, 1, 2, 5, 6}, &rows, &settings);
    matrix.emplace_back(3, cont{}, &rows, &settings);
    matrix.emplace_back(4, cont{0, 1, 3, 5}, &rows, &settings);
    matrix.emplace_back(matrix[1], 5, &rows);
  } else {
    using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;
    matrix.emplace_back(0, cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, &rows, &settings);
    matrix.emplace_back(1, cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, &rows, &settings);
    matrix.emplace_back(2, cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, &rows, &settings);
    matrix.emplace_back(3, cont{}, &rows, &settings);
    matrix.emplace_back(4, cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, &rows, &settings);
    matrix.emplace_back(matrix[1], 5, &rows);
  }

  return matrix;
}